

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

bool __thiscall capnp::DynamicStruct::Reader::has(Reader *this,Field field,HasMode mode)

{
  bool bVar1;
  uchar uVar2;
  unsigned_short uVar3;
  uint16_t uVar4;
  Which WVar5;
  Which WVar6;
  uint32_t uVar7;
  StructDataOffset SVar8;
  uint uVar9;
  StructPointerOffset ptrIndex;
  unsigned_long uVar10;
  bool local_1a9;
  bool local_199;
  bool local_189;
  bool local_179;
  bool local_169;
  PointerReader local_138;
  undefined1 local_118 [8];
  Type type;
  Reader slot;
  Reader local_a8;
  unsigned_short local_72;
  undefined1 local_70 [6];
  uint16_t discrim;
  Reader proto;
  Fault local_30;
  Fault f;
  HasMode mode_local;
  Reader *this_local;
  
  f.exception = (Exception *)StructSchema::Field::getContainingStruct(&field);
  bVar1 = Schema::operator==((Schema *)&f,(Schema *)this);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x1a2,FAILED,"field.getContainingStruct() == schema",
               "\"`field` is not a field of this struct.\"",
               (char (*) [39])"`field` is not a field of this struct.");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  StructSchema::Field::getProto((Reader *)local_70,&field);
  bVar1 = anon_unknown_70::hasDiscriminantValue((Reader *)local_70);
  if (bVar1) {
    Schema::getProto((Reader *)&slot._reader.nestingLimit,(Schema *)this);
    capnp::schema::Node::Reader::getStruct(&local_a8,(Reader *)&slot._reader.nestingLimit);
    uVar7 = capnp::schema::Node::Struct::Reader::getDiscriminantOffset(&local_a8);
    SVar8 = assumeDataOffset(uVar7);
    uVar3 = capnp::_::StructReader::getDataField<unsigned_short>(&this->reader,SVar8);
    local_72 = uVar3;
    uVar4 = capnp::schema::Field::Reader::getDiscriminantValue((Reader *)local_70);
    if (uVar3 != uVar4) {
      return false;
    }
  }
  WVar5 = capnp::schema::Field::Reader::which((Reader *)local_70);
  if ((WVar5 == SLOT) || (WVar5 != GROUP)) {
    capnp::schema::Field::Reader::getSlot((Reader *)&type.field_4,(Reader *)local_70);
    _local_118 = StructSchema::Field::getType(&field);
    WVar6 = capnp::Type::which((Type *)local_118);
    switch(WVar6) {
    case VOID:
      this_local._7_1_ = mode == NON_NULL;
      break;
    case BOOL:
      local_169 = true;
      if (mode != NON_NULL) {
        uVar7 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&type.field_4);
        SVar8 = assumeDataOffset(uVar7);
        local_169 = capnp::_::StructReader::getDataField<bool>(&this->reader,SVar8,false);
      }
      this_local._7_1_ = local_169;
      break;
    case INT8:
    case UINT8:
      local_179 = true;
      if (mode != NON_NULL) {
        uVar7 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&type.field_4);
        SVar8 = assumeDataOffset(uVar7);
        uVar2 = capnp::_::StructReader::getDataField<unsigned_char>(&this->reader,SVar8,'\0');
        local_179 = uVar2 != '\0';
      }
      this_local._7_1_ = local_179;
      break;
    case INT16:
    case UINT16:
    case ENUM:
      local_189 = true;
      if (mode != NON_NULL) {
        uVar7 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&type.field_4);
        SVar8 = assumeDataOffset(uVar7);
        uVar3 = capnp::_::StructReader::getDataField<unsigned_short>(&this->reader,SVar8,0);
        local_189 = uVar3 != 0;
      }
      this_local._7_1_ = local_189;
      break;
    case INT32:
    case UINT32:
    case FLOAT32:
      local_199 = true;
      if (mode != NON_NULL) {
        uVar7 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&type.field_4);
        SVar8 = assumeDataOffset(uVar7);
        uVar9 = capnp::_::StructReader::getDataField<unsigned_int>(&this->reader,SVar8,0);
        local_199 = uVar9 != 0;
      }
      this_local._7_1_ = local_199;
      break;
    case INT64:
    case UINT64:
    case FLOAT64:
      local_1a9 = true;
      if (mode != NON_NULL) {
        uVar7 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&type.field_4);
        SVar8 = assumeDataOffset(uVar7);
        uVar10 = capnp::_::StructReader::getDataField<unsigned_long>(&this->reader,SVar8,0);
        local_1a9 = uVar10 != 0;
      }
      this_local._7_1_ = local_1a9;
      break;
    case TEXT:
    case DATA:
    case LIST:
    case STRUCT:
    case INTERFACE:
    case ANY_POINTER:
      uVar7 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&type.field_4);
      ptrIndex = assumePointerOffset(uVar7);
      capnp::_::StructReader::getPointerField(&local_138,&this->reader,ptrIndex);
      bVar1 = capnp::_::PointerReader::isNull(&local_138);
      this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
      break;
    default:
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DynamicStruct::Reader::has(StructSchema::Field field, HasMode mode) const {
  KJ_REQUIRE(field.getContainingStruct() == schema, "`field` is not a field of this struct.");

  auto proto = field.getProto();
  if (hasDiscriminantValue(proto)) {
    uint16_t discrim = reader.getDataField<uint16_t>(
        assumeDataOffset(schema.getProto().getStruct().getDiscriminantOffset()));
    if (discrim != proto.getDiscriminantValue()) {
      // Field is not active in the union.
      return false;
    }
  }

  switch (proto.which()) {
    case schema::Field::SLOT:
      // Continue to below.
      break;

    case schema::Field::GROUP:
      return true;
  }

  auto slot = proto.getSlot();
  auto type = field.getType();

  switch (type.which()) {
    case schema::Type::VOID:
      // Void is always equal to the default.
      return mode == HasMode::NON_NULL;

    case schema::Type::BOOL:
      return mode == HasMode::NON_NULL ||
          reader.getDataField<bool>(assumeDataOffset(slot.getOffset()), 0) != 0;

    case schema::Type::INT8:
    case schema::Type::UINT8:
      return mode == HasMode::NON_NULL ||
          reader.getDataField<uint8_t>(assumeDataOffset(slot.getOffset()), 0) != 0;

    case schema::Type::INT16:
    case schema::Type::UINT16:
    case schema::Type::ENUM:
      return mode == HasMode::NON_NULL ||
          reader.getDataField<uint16_t>(assumeDataOffset(slot.getOffset()), 0) != 0;

    case schema::Type::INT32:
    case schema::Type::UINT32:
    case schema::Type::FLOAT32:
      return mode == HasMode::NON_NULL ||
          reader.getDataField<uint32_t>(assumeDataOffset(slot.getOffset()), 0) != 0;

    case schema::Type::INT64:
    case schema::Type::UINT64:
    case schema::Type::FLOAT64:
      return mode == HasMode::NON_NULL ||
          reader.getDataField<uint64_t>(assumeDataOffset(slot.getOffset()), 0) != 0;

    case schema::Type::TEXT:
    case schema::Type::DATA:
    case schema::Type::LIST:
    case schema::Type::STRUCT:
    case schema::Type::ANY_POINTER:
    case schema::Type::INTERFACE:
      return !reader.getPointerField(assumePointerOffset(slot.getOffset())).isNull();
  }

  // Unknown type.  As far as we know, it isn't set.
  return false;
}